

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFE.cpp
# Opt level: O1

void __thiscall Storage::Disk::HFE::HFE(HFE *this,string *file_name)

{
  FileHolder *this_00;
  bool bVar1;
  uint8_t uVar2;
  byte bVar3;
  uint16_t uVar4;
  undefined4 *puVar5;
  undefined4 uVar6;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__HFE_005aa430;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  bVar1 = FileHolder::check_signature(this_00,"HXCPICFE",0);
  if (bVar1) {
    uVar2 = FileHolder::get8(this_00);
    if (uVar2 == '\0') {
      bVar3 = FileHolder::get8(this_00);
      this->track_count_ = (uint)bVar3;
      bVar3 = FileHolder::get8(this_00);
      this->head_count_ = (uint)bVar3;
      FileHolder::seek(this_00,7,1);
      uVar4 = FileHolder::get16le(this_00);
      this->track_list_offset_ = (ulong)uVar4 << 9;
      return;
    }
    uVar6 = 0xfffffffd;
  }
  else {
    uVar6 = 0xfffffffe;
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = uVar6;
  __cxa_throw(puVar5,&Error::typeinfo,0);
}

Assistant:

HFE::HFE(const std::string &file_name) :
		file_(file_name) {
	if(!file_.check_signature("HXCPICFE")) throw Error::InvalidFormat;

	if(file_.get8()) throw Error::UnknownVersion;
	track_count_ = file_.get8();
	head_count_ = file_.get8();

	file_.seek(7, SEEK_CUR);
	track_list_offset_ = long(file_.get16le()) << 9;
}